

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcatString.h
# Opt level: O3

int __thiscall
Js::ConcatStringMulti::GetRandomAccessItemsFromConcatString
          (ConcatStringMulti *this,JavascriptString ***items)

{
  Type *pTVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  undefined4 *puVar5;
  ulong uVar6;
  
  uVar4 = this->slotCount;
  uVar6 = (ulong)uVar4;
  do {
    if (uVar6 == 0) goto LAB_00b2ef24;
    pTVar1 = &this->__alignmentPTR + uVar6;
    uVar6 = uVar6 - 1;
  } while (*pTVar1 != 0);
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar5 = 1;
  bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/ConcatString.h"
                              ,0x105,"(IsFilled())","IsFilled()");
  if (!bVar3) {
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  *puVar5 = 0;
  uVar4 = this->slotCount;
LAB_00b2ef24:
  *items = (JavascriptString **)(this + 1);
  return uVar4;
}

Assistant:

virtual int GetRandomAccessItemsFromConcatString(Js::JavascriptString * const *& items) const
        {
            Assert(IsFilled());
            items = AddressOf(m_slots[0]);
            return slotCount;
        }